

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

bool __thiscall
absl::lts_20250127::container_internal::HashSetResizeHelper::
InitializeSlots<std::allocator<char>,4ul,true,true,4ul>
          (HashSetResizeHelper *this,CommonFields *c,allocator<char> *param_3,ctrl_t param_4)

{
  ulong uVar1;
  ctrl_t *__s;
  void *pvVar2;
  long *plVar3;
  size_t capacity;
  bool bVar4;
  bool bVar5;
  RawHashSetLayout layout;
  undefined1 local_49;
  RawHashSetLayout local_48;
  
  if (c->capacity_ == 0) {
    __assert_fail("(c.capacity()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x81d,
                  "bool absl::container_internal::HashSetResizeHelper::InitializeSlots(CommonFields &, Alloc, ctrl_t, size_t, size_t) [Alloc = std::allocator<char>, SizeOfSlot = 4UL, TransferUsesMemcpy = true, SooEnabled = true, AlignOfSlot = 4UL]"
                 );
  }
  if ((c->size_ & 1) != 0 && (c->size_ < 2 & this->was_soo_) == 0) {
    CommonFields::backing_array_start(c);
  }
  RawHashSetLayout::RawHashSetLayout(&local_48,c->capacity_,4,false);
  if (~local_48.slot_offset_ / local_48.capacity_ < 4) {
    __assert_fail("(slot_size <= ((std::numeric_limits<size_t>::max)() - slot_offset_) / capacity_) && \"Try enabling sanitizers.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x4cf,
                  "size_t absl::container_internal::RawHashSetLayout::alloc_size(size_t) const");
  }
  pvVar2 = Allocate<8ul,std::allocator<char>>
                     (param_3,local_48.slot_offset_ + local_48.capacity_ * 4);
  (c->heap_or_soo_).heap.control = (ctrl_t *)((long)pvVar2 + local_48.control_offset_);
  plVar3 = (long *)((long)pvVar2 + (local_48.control_offset_ - 8));
  (c->heap_or_soo_).heap.slot_array.p = (void *)((long)pvVar2 + local_48.slot_offset_);
  if (((ulong)plVar3 & 7) != 0) {
    __assert_fail("(reinterpret_cast<uintptr_t>(gl_ptr) % alignof(GrowthInfo) == 0) && \"Try enabling sanitizers.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x590,"GrowthInfo &absl::container_internal::CommonFields::growth_info()");
  }
  uVar1 = c->capacity_;
  if ((uVar1 != 0) && ((uVar1 + 1 & uVar1) == 0)) {
    *plVar3 = uVar1 - ((c->size_ >> 1) + (uVar1 >> 3));
    bVar4 = local_48.capacity_ < 0x11;
    bVar5 = this->old_capacity_ < local_48.capacity_;
    if ((bVar5 && bVar4) && (this->was_soo_ != false)) {
      InitControlBytesAfterSoo(this,(c->heap_or_soo_).heap.control,param_4,local_48.capacity_);
      if (this->had_soo_slot_ == true) {
        TransferSlotAfterSoo(this,c,4);
      }
    }
    else if (bVar5 && bVar4) {
      GrowSizeIntoSingleGroupTransferable(this,c,4);
      DeallocateOld<4ul,std::allocator<char>>(this,&local_49,4);
    }
    else {
      __s = (c->heap_or_soo_).heap.control;
      memset(__s,0x80,uVar1 + 0x10);
      __s[uVar1] = kSentinel;
    }
    *(byte *)&c->size_ = (byte)c->size_ & 0xfe;
    return bVar5 && bVar4;
  }
  __assert_fail("(IsValidCapacity(capacity)) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x622,"size_t absl::container_internal::CapacityToGrowth(size_t)");
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE bool InitializeSlots(CommonFields& c, Alloc alloc,
                                               ctrl_t soo_slot_h2,
                                               size_t key_size,
                                               size_t value_size) {
    ABSL_SWISSTABLE_ASSERT(c.capacity());
    HashtablezInfoHandle infoz =
        ShouldSampleHashtablezInfo<Alloc>()
            ? SampleHashtablezInfo<SooEnabled>(SizeOfSlot, key_size, value_size,
                                               old_capacity_, was_soo_,
                                               forced_infoz_, c)
            : HashtablezInfoHandle{};

    const bool has_infoz = infoz.IsSampled();
    RawHashSetLayout layout(c.capacity(), AlignOfSlot, has_infoz);
    char* mem = static_cast<char*>(Allocate<BackingArrayAlignment(AlignOfSlot)>(
        &alloc, layout.alloc_size(SizeOfSlot)));
    const GenerationType old_generation = c.generation();
    c.set_generation_ptr(
        reinterpret_cast<GenerationType*>(mem + layout.generation_offset()));
    c.set_generation(NextGeneration(old_generation));
    c.set_control(reinterpret_cast<ctrl_t*>(mem + layout.control_offset()));
    c.set_slots(mem + layout.slot_offset());
    ResetGrowthLeft(c);

    const bool grow_single_group =
        IsGrowingIntoSingleGroupApplicable(old_capacity_, layout.capacity());
    if (SooEnabled && was_soo_ && grow_single_group) {
      InitControlBytesAfterSoo(c.control(), soo_slot_h2, layout.capacity());
      if (TransferUsesMemcpy && had_soo_slot_) {
        TransferSlotAfterSoo(c, SizeOfSlot);
      }
      // SooEnabled implies that old_capacity_ != 0.
    } else if ((SooEnabled || old_capacity_ != 0) && grow_single_group) {
      if (TransferUsesMemcpy) {
        GrowSizeIntoSingleGroupTransferable(c, SizeOfSlot);
        DeallocateOld<AlignOfSlot>(alloc, SizeOfSlot);
      } else {
        GrowIntoSingleGroupShuffleControlBytes(c.control(), layout.capacity());
      }
    } else {
      ResetCtrl(c, SizeOfSlot);
    }

    c.set_has_infoz(has_infoz);
    if (has_infoz) {
      infoz.RecordStorageChanged(c.size(), layout.capacity());
      if ((SooEnabled && was_soo_) || grow_single_group || old_capacity_ == 0) {
        infoz.RecordRehash(0);
      }
      c.set_infoz(infoz);
    }
    return grow_single_group;
  }